

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

size_t kvtree_pack(char *buf,kvtree *hash)

{
  char *__dest;
  kvtree_elem_struct *pkVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  anon_struct_16_2_6a822a49_for_pointers *paVar5;
  long lVar6;
  size_t sVar7;
  
  if (hash == (kvtree *)0x0) {
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    sVar7 = 4;
  }
  else {
    uVar2 = 0;
    for (paVar5 = (anon_struct_16_2_6a822a49_for_pointers *)hash;
        paVar5->le_next != (kvtree_elem_struct *)0x0; paVar5 = &paVar5->le_next->pointers) {
      uVar2 = uVar2 + 1;
    }
    *(uint *)buf = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    sVar7 = 4;
    while (pkVar1 = ((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next,
          pkVar1 != (kvtree_elem_struct *)0x0) {
      __dest = buf + sVar7;
      if (pkVar1->key == (char *)0x0) {
        *__dest = '\0';
        lVar6 = 1;
      }
      else {
        strcpy(__dest,pkVar1->key);
        sVar3 = strlen(pkVar1->key);
        lVar6 = sVar3 + 1;
      }
      sVar4 = kvtree_pack(__dest + lVar6,pkVar1->hash);
      sVar7 = sVar7 + lVar6 + sVar4;
      hash = (kvtree *)&pkVar1->pointers;
    }
  }
  return sVar7;
}

Assistant:

size_t kvtree_pack(char* buf, const kvtree* hash)
{
  size_t size = 0;
  if (hash != NULL) {
    kvtree_elem* elem;

    /* count the items in the hash */
    uint32_t count = 0;
    LIST_FOREACH(elem, hash, pointers) {
      count++;
    }

    /* pack the count value */
    uint32_t count_network = kvtree_hton32(count);
    memcpy(buf + size, &count_network, sizeof(uint32_t));
    size += sizeof(uint32_t);

    /* pack each element */
    LIST_FOREACH(elem, hash, pointers) {
      size += kvtree_elem_pack(buf + size, elem);
    }
  } else {
    /* no hash -- just pack the count of 0 */
    uint32_t count_network = kvtree_hton32((uint32_t) 0);
    memcpy(buf + size, &count_network, sizeof(uint32_t));
    size += sizeof(uint32_t);
  }
  return size;
}